

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timMan.c
# Opt level: O0

int Tim_ManPoNum(Tim_Man_t *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iLastBoxId;
  Tim_Man_t *p_local;
  
  iVar1 = Tim_ManBoxNum(p);
  if (iVar1 == 0) {
    p_local._4_4_ = Tim_ManCoNum(p);
  }
  else {
    iVar1 = Tim_ManBoxNum(p);
    iVar2 = Tim_ManCoNum(p);
    iVar3 = Tim_ManBoxInputFirst(p,iVar1 + -1);
    iVar1 = Tim_ManBoxInputNum(p,iVar1 + -1);
    p_local._4_4_ = iVar2 - (iVar3 + iVar1);
  }
  return p_local._4_4_;
}

Assistant:

int Tim_ManPoNum( Tim_Man_t * p )
{
    int iLastBoxId;
    if ( Tim_ManBoxNum(p) == 0 )
        return Tim_ManCoNum(p);
    iLastBoxId = Tim_ManBoxNum(p) - 1;
    return Tim_ManCoNum(p) - (Tim_ManBoxInputFirst(p, iLastBoxId) + Tim_ManBoxInputNum(p, iLastBoxId));
}